

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deArrayBuffer.cpp
# Opt level: O3

void * de::detail::ArrayBuffer_AlignedMalloc(size_t numBytes,size_t alignment)

{
  void *pvVar1;
  undefined8 *puVar2;
  
  if (numBytes >> 0x1f == 0) {
    pvVar1 = deAlignedMalloc(numBytes,(long)(int)alignment);
    if (pvVar1 != (void *)0x0) {
      return pvVar1;
    }
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = time;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void* ArrayBuffer_AlignedMalloc (size_t numBytes, size_t alignment)
{
	const int	sizeAsInt	= (int)numBytes;
	void*		ptr;

	// int overflow
	if (sizeAsInt < 0 || numBytes != (size_t)sizeAsInt)
		throw std::bad_alloc();

	// alloc
	ptr = deAlignedMalloc(sizeAsInt, (int)alignment);
	if (!ptr)
		throw std::bad_alloc();

	// mark area as undefined for valgrind
#if defined(DE_VALGRIND_BUILD) && defined(HAVE_VALGRIND_MEMCHECK_H)
	if (RUNNING_ON_VALGRIND)
	{
		VALGRIND_MAKE_MEM_UNDEFINED(ptr, numBytes);
	}
#endif

	return ptr;
}